

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

char * get_header_name(c2m_ctx_t c2m_ctx,VARR_token_t *buffer,pos_t err_pos,char **content)

{
  char cVar1;
  short sVar2;
  token_t *pptVar3;
  token_t *pptVar4;
  VARR_char *pVVar5;
  VARR_char *pVVar6;
  size_t sVar7;
  pos_t p;
  long lVar8;
  ulong uVar9;
  char *pcVar10;
  char *pcVar11;
  node_t_conflict n;
  token_t ptVar12;
  char *pcVar13;
  long *plVar14;
  undefined8 *puVar15;
  void *pvVar16;
  VARR_token_t *pVVar17;
  long extraout_RDX;
  ulong uVar18;
  VARR_token_t *pVVar19;
  c2m_ctx_t __ptr;
  ulong uVar20;
  VARR_token_t *pVVar21;
  ulong uVar22;
  size_t __size;
  str_t sVar23;
  char *local_70;
  size_t local_68;
  
  *content = (char *)0x0;
  pVVar19 = buffer;
  __ptr = c2m_ctx;
  if (buffer == (VARR_token_t *)0x0) {
LAB_001941d6:
    get_header_name_cold_15();
LAB_001941db:
    get_header_name_cold_12();
LAB_001941e0:
    get_header_name_cold_13();
  }
  else {
    uVar9 = buffer->els_num;
    if (uVar9 != 0) {
      pptVar3 = buffer->varr;
      if (pptVar3 == (token_t *)0x0) goto LAB_001941db;
      uVar18 = 0;
      do {
        __ptr = (c2m_ctx_t)pptVar3[uVar18];
        if (*(short *)&__ptr->ctx != 0x20) {
          if ((uVar18 < uVar9) && (*(int *)(__ptr->env[0].__jmpbuf + 1) == 0x17)) {
            uVar22 = uVar18 + 1;
            pVVar19 = (VARR_token_t *)CONCAT71((int7)((ulong)buffer >> 8),uVar22 < uVar9);
            if (uVar22 < uVar9) {
              pcVar13 = ((pos_t *)&__ptr->options)->fname;
              pptVar4 = (token_t *)__ptr->env[0].__jmpbuf[0];
              p = *(pos_t *)&__ptr->options;
              __ptr = (c2m_ctx_t)pptVar3[uVar18 + 1];
              uVar20 = uVar22;
              if (*(int *)(__ptr->env[0].__jmpbuf + 1) == 0x19) goto LAB_00193db0;
              __ptr = (c2m_ctx_t)(2 - uVar9);
              goto LAB_00193d8d;
            }
          }
          break;
        }
        uVar18 = uVar18 + 1;
      } while (uVar9 != uVar18);
    }
LAB_0019413a:
    pVVar21 = (VARR_token_t *)buffer->els_num;
    if (pVVar21 == (VARR_token_t *)0x0) {
      pVVar17 = (VARR_token_t *)0x0;
    }
    else {
      if (buffer->varr == (token_t *)0x0) goto LAB_001941e0;
      pVVar17 = (VARR_token_t *)(ulong)(*(short *)*buffer->varr == 0x20);
    }
    pVVar19 = (VARR_token_t *)((long)&pVVar21[-1].varr + 7);
    if (pVVar17 != pVVar19) {
LAB_001941a4:
      error(c2m_ctx,0x1c3085,err_pos.fname,err_pos._8_8_);
      return (char *)0x0;
    }
    if ((pVVar17 < pVVar21) && (buffer->varr != (token_t *)0x0)) {
      ptVar12 = buffer->varr[(long)pVVar17];
      sVar2 = *(short *)ptVar12;
      if ((sVar2 == 0x102) || (sVar2 == 0x13e)) {
        pcVar13 = get_include_fname(c2m_ctx,ptVar12,content);
        return pcVar13;
      }
      goto LAB_001941a4;
    }
  }
  get_header_name_cold_14();
LAB_001941ea:
  get_header_name_cold_9();
LAB_001941ef:
  get_header_name_cold_11();
LAB_001941f4:
  get_header_name_cold_10();
LAB_001941f9:
  get_header_name_cold_3();
LAB_001941fe:
  get_header_name_cold_8();
LAB_00194203:
  get_header_name_cold_7();
LAB_00194208:
  get_header_name_cold_6();
  goto LAB_0019420d;
  while( true ) {
    lVar8 = uVar20 + 1;
    uVar20 = uVar20 + 1;
    if (pptVar3[lVar8]->node_code == N_GT) break;
LAB_00193d8d:
    pVVar19 = (VARR_token_t *)((long)__ptr->env[0].__jmpbuf + (uVar20 - 0x10));
    if (pVVar19 == (VARR_token_t *)&DAT_00000001) goto LAB_0019413a;
  }
  pVVar19 = (VARR_token_t *)CONCAT71((int7)((ulong)pptVar3[lVar8] >> 8),uVar20 < uVar9);
LAB_00193db0:
  if ((char)pVVar19 == '\0') goto LAB_0019413a;
  pVVar5 = c2m_ctx->symbol_text;
  if ((pVVar5 == (VARR_char *)0x0) || (__ptr = (c2m_ctx_t)pVVar5->varr, __ptr == (c2m_ctx_t)0x0))
  goto LAB_001941ef;
  pVVar5->els_num = 0;
  pVVar6 = c2m_ctx->temp_string;
  if ((pVVar6 == (VARR_char *)0x0) || (pVVar6->varr == (char *)0x0)) goto LAB_001941f4;
  pVVar6->els_num = 0;
  uVar9 = pVVar5->els_num + 1;
  if (pVVar5->size < uVar9) {
    pVVar21 = (VARR_token_t *)((uVar9 >> 1) + uVar9);
    pVVar19 = pVVar21;
    pcVar10 = (char *)realloc(__ptr,(size_t)pVVar21);
    pVVar5->varr = pcVar10;
    pVVar5->size = (size_t)pVVar21;
  }
  sVar7 = pVVar5->els_num;
  pVVar5->els_num = sVar7 + 1;
  pVVar5->varr[sVar7] = '<';
  if (uVar22 < uVar20) {
    do {
      if ((buffer->varr == (token_t *)0x0) || (buffer->els_num <= uVar22)) goto LAB_001941ea;
      pcVar10 = buffer->varr[uVar22]->repr;
      cVar1 = *pcVar10;
      while (cVar1 != '\0') {
        pVVar5 = c2m_ctx->symbol_text;
        __ptr = (c2m_ctx_t)pVVar5->varr;
        if (__ptr == (c2m_ctx_t)0x0) {
LAB_001941d1:
          get_header_name_cold_2();
          goto LAB_001941d6;
        }
        uVar9 = pVVar5->els_num + 1;
        if (pVVar5->size < uVar9) {
          pVVar21 = (VARR_token_t *)((uVar9 >> 1) + uVar9);
          pVVar19 = pVVar21;
          pcVar11 = (char *)realloc(__ptr,(size_t)pVVar21);
          pVVar5->varr = pcVar11;
          pVVar5->size = (size_t)pVVar21;
        }
        sVar7 = pVVar5->els_num;
        pVVar5->els_num = sVar7 + 1;
        pVVar5->varr[sVar7] = cVar1;
        pVVar5 = c2m_ctx->temp_string;
        __ptr = (c2m_ctx_t)pVVar5->varr;
        if (__ptr == (c2m_ctx_t)0x0) {
          get_header_name_cold_1();
          goto LAB_001941d1;
        }
        cVar1 = *pcVar10;
        uVar9 = pVVar5->els_num + 1;
        if (pVVar5->size < uVar9) {
          pVVar21 = (VARR_token_t *)((uVar9 >> 1) + uVar9);
          pVVar19 = pVVar21;
          pcVar11 = (char *)realloc(__ptr,(size_t)pVVar21);
          pVVar5->varr = pcVar11;
          pVVar5->size = (size_t)pVVar21;
        }
        sVar7 = pVVar5->els_num;
        pVVar5->els_num = sVar7 + 1;
        pVVar5->varr[sVar7] = cVar1;
        cVar1 = pcVar10[1];
        pcVar10 = pcVar10 + 1;
      }
      uVar22 = uVar22 + 1;
    } while (uVar22 != uVar20);
  }
  pVVar5 = c2m_ctx->symbol_text;
  __ptr = (c2m_ctx_t)pVVar5->varr;
  if (__ptr == (c2m_ctx_t)0x0) goto LAB_001941fe;
  uVar9 = pVVar5->els_num + 1;
  if (pVVar5->size < uVar9) {
    pVVar21 = (VARR_token_t *)((uVar9 >> 1) + uVar9);
    pVVar19 = pVVar21;
    pcVar10 = (char *)realloc(__ptr,(size_t)pVVar21);
    pVVar5->varr = pcVar10;
    pVVar5->size = (size_t)pVVar21;
  }
  sVar7 = pVVar5->els_num;
  pVVar5->els_num = sVar7 + 1;
  pVVar5->varr[sVar7] = '>';
  pVVar5 = c2m_ctx->symbol_text;
  __ptr = (c2m_ctx_t)pVVar5->varr;
  if (__ptr == (c2m_ctx_t)0x0) goto LAB_00194203;
  uVar9 = pVVar5->els_num + 1;
  if (pVVar5->size < uVar9) {
    pVVar21 = (VARR_token_t *)((uVar9 >> 1) + uVar9);
    pVVar19 = pVVar21;
    pcVar10 = (char *)realloc(__ptr,(size_t)pVVar21);
    pVVar5->varr = pcVar10;
    pVVar5->size = (size_t)pVVar21;
  }
  sVar7 = pVVar5->els_num;
  pVVar5->els_num = sVar7 + 1;
  pVVar5->varr[sVar7] = '\0';
  pVVar5 = c2m_ctx->temp_string;
  __ptr = (c2m_ctx_t)pVVar5->varr;
  if (__ptr == (c2m_ctx_t)0x0) goto LAB_00194208;
  uVar9 = pVVar5->els_num + 1;
  if (pVVar5->size < uVar9) {
    __size = (uVar9 >> 1) + uVar9;
    pcVar10 = (char *)realloc(__ptr,__size);
    pVVar5->varr = pcVar10;
    pVVar5->size = __size;
  }
  sVar7 = pVVar5->els_num;
  pVVar5->els_num = sVar7 + 1;
  pVVar5->varr[sVar7] = '\0';
  pVVar19 = (VARR_token_t *)(uVar18 & 0xffffffff);
  __ptr = (c2m_ctx_t)buffer;
  del_tokens(buffer,(int)uVar18,(int)uVar20 - (int)uVar18);
  if (c2m_ctx->symbol_text != (VARR_char *)0x0) {
    if (c2m_ctx->temp_string == (VARR_char *)0x0) goto LAB_00194212;
    pcVar10 = c2m_ctx->symbol_text->varr;
    sVar23 = uniq_cstr(c2m_ctx,c2m_ctx->temp_string->varr);
    n = new_node(c2m_ctx,N_STR);
    add_pos(c2m_ctx,n,p);
    local_70 = sVar23.s;
    (n->u).l = (mir_long)local_70;
    local_68 = sVar23.len;
    (n->u).s.len = local_68;
    sVar23 = uniq_cstr(c2m_ctx,pcVar10);
    pVVar19 = (VARR_token_t *)0x30;
    __ptr = c2m_ctx;
    ptVar12 = (token_t)reg_malloc(c2m_ctx,0x30);
    *(undefined4 *)ptVar12 = 0x13e;
    (ptVar12->pos).fname = pcVar13;
    *(token_t **)&(ptVar12->pos).lno = pptVar4;
    ptVar12->repr = sVar23.s;
    ptVar12->node_code = N_IGNORE;
    ptVar12->node = n;
    if ((buffer->varr != (token_t *)0x0) && (uVar18 < buffer->els_num)) {
      buffer->varr[uVar18] = ptVar12;
      goto LAB_0019413a;
    }
    goto LAB_001941f9;
  }
LAB_0019420d:
  get_header_name_cold_5();
LAB_00194212:
  get_header_name_cold_4();
  plVar14 = (long *)malloc(0x30);
  *plVar14 = (long)__ptr;
  plVar14[1] = (long)pVVar19;
  plVar14[2] = extraout_RDX;
  *(undefined4 *)(plVar14 + 4) = 0;
  plVar14[3] = 0;
  pcVar13 = &DAT_00000018;
  puVar15 = (undefined8 *)malloc(0x18);
  plVar14[5] = (long)puVar15;
  if (puVar15 != (undefined8 *)0x0) {
    *puVar15 = 0;
    puVar15[1] = 0x40;
    pvVar16 = malloc(0x200);
    puVar15[2] = pvVar16;
    return (char *)plVar14;
  }
  mir_varr_error(pcVar13);
}

Assistant:

static const char *get_header_name (c2m_ctx_t c2m_ctx, VARR (token_t) * buffer, pos_t err_pos,
                                    const char **content) {
  size_t i;

  *content = NULL;
  transform_to_header (c2m_ctx, buffer);
  i = 0;
  if (VARR_LENGTH (token_t, buffer) != 0 && VARR_GET (token_t, buffer, 0)->code == ' ') i++;
  if (i != VARR_LENGTH (token_t, buffer) - 1
      || (VARR_GET (token_t, buffer, i)->code != T_STR
          && VARR_GET (token_t, buffer, i)->code != T_HEADER)) {
    error (c2m_ctx, err_pos, "wrong #include");
    return NULL;
  }
  return get_include_fname (c2m_ctx, VARR_GET (token_t, buffer, i), content);
}